

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O1

bool __thiscall mkvmuxer::Tag::ExpandSimpleTagsArray(Tag *this)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  int iVar3;
  uint uVar4;
  SimpleTag *pSVar5;
  undefined8 uVar6;
  SimpleTag *pSVar7;
  long lVar8;
  ulong uVar9;
  int iVar10;
  bool bVar11;
  
  iVar3 = this->simple_tags_size_;
  uVar4 = this->simple_tags_count_;
  bVar11 = true;
  if (iVar3 <= (int)uVar4) {
    iVar10 = 1;
    if (iVar3 != 0) {
      iVar10 = iVar3 * 2;
    }
    uVar9 = 0xffffffffffffffff;
    if (-1 < iVar10) {
      uVar9 = (long)iVar10 << 4;
    }
    pSVar7 = (SimpleTag *)operator_new__(uVar9,(nothrow_t *)&std::nothrow);
    bVar11 = pSVar7 != (SimpleTag *)0x0;
    if (bVar11) {
      if (0 < (int)uVar4) {
        pSVar5 = this->simple_tags_;
        lVar8 = 0;
        do {
          puVar1 = (undefined8 *)((long)&pSVar5->tag_name_ + lVar8);
          uVar6 = puVar1[1];
          puVar2 = (undefined8 *)((long)&pSVar7->tag_name_ + lVar8);
          *puVar2 = *puVar1;
          puVar2[1] = uVar6;
          lVar8 = lVar8 + 0x10;
        } while ((ulong)uVar4 << 4 != lVar8);
      }
      if (this->simple_tags_ != (SimpleTag *)0x0) {
        operator_delete__(this->simple_tags_);
      }
      this->simple_tags_ = pSVar7;
      this->simple_tags_size_ = iVar10;
    }
  }
  return bVar11;
}

Assistant:

bool Tag::ExpandSimpleTagsArray() {
  if (simple_tags_size_ > simple_tags_count_)
    return true;  // nothing to do yet

  const int size = (simple_tags_size_ == 0) ? 1 : 2 * simple_tags_size_;

  SimpleTag* const simple_tags = new (std::nothrow) SimpleTag[size];  // NOLINT
  if (simple_tags == NULL)
    return false;

  for (int idx = 0; idx < simple_tags_count_; ++idx) {
    simple_tags[idx] = simple_tags_[idx];  // shallow copy
  }

  delete[] simple_tags_;

  simple_tags_ = simple_tags;
  simple_tags_size_ = size;

  return true;
}